

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

void __thiscall duckdb_re2::Regexp::Destroy(Regexp *this)

{
  Regexp *this_00;
  bool bVar1;
  uint16_t uVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  Regexp *pRVar4;
  int i;
  ulong uVar5;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar1 = QuickDestroy(this);
  if (!bVar1) {
    this->down_ = (Regexp *)0x0;
    do {
      pRVar4 = this->down_;
      if (this->ref_ != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Bad reference count ",0x14);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      if (this->nsub_ != 0) {
        if (this->nsub_ == 1) {
          paVar3 = &this->field_5;
        }
        else {
          paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
        }
        uVar5 = 0;
        do {
          this_00 = paVar3[uVar5].subone_;
          if (this_00 != (Regexp *)0x0) {
            if (this_00->ref_ == 0xffff) {
              Decref(this_00);
              uVar2 = this_00->ref_;
            }
            else {
              uVar2 = this_00->ref_ - 1;
              this_00->ref_ = uVar2;
            }
            if (uVar2 == 0) {
              bVar1 = QuickDestroy(this_00);
              if (!bVar1) {
                this_00->down_ = pRVar4;
                pRVar4 = this_00;
              }
            }
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < this->nsub_);
        if (1 < this->nsub_) {
          operator_delete__(paVar3);
        }
        this->nsub_ = 0;
      }
      ~Regexp(this);
      operator_delete(this);
      this = pRVar4;
    } while (pRVar4 != (Regexp *)0x0);
  }
  return;
}

Assistant:

void Regexp::Destroy() {
  if (QuickDestroy())
    return;

  // Handle recursive Destroy with explicit stack
  // to avoid arbitrarily deep recursion on process stack [sigh].
  down_ = NULL;
  Regexp* stack = this;
  while (stack != NULL) {
    Regexp* re = stack;
    stack = re->down_;
    if (re->ref_ != 0)
      LOG(DFATAL) << "Bad reference count " << re->ref_;
    if (re->nsub_ > 0) {
      Regexp** subs = re->sub();
      for (int i = 0; i < re->nsub_; i++) {
        Regexp* sub = subs[i];
        if (sub == NULL)
          continue;
        if (sub->ref_ == kMaxRef)
          sub->Decref();
        else
          --sub->ref_;
        if (sub->ref_ == 0 && !sub->QuickDestroy()) {
          sub->down_ = stack;
          stack = sub;
        }
      }
      if (re->nsub_ > 1)
        delete[] subs;
      re->nsub_ = 0;
    }
    delete re;
  }
}